

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopyHeadingTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  string_view value;
  string_view value_00;
  FileDescriptorProto *pFVar1;
  char *pcVar2;
  bool bVar3;
  Edition EVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  FileOptions *pFVar7;
  FileOptions *pFVar8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  FileDescriptorProto *local_98;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  char *local_80;
  string_view *local_78;
  FileDescriptorProto *local_70;
  size_t local_68;
  char *local_60;
  string_view *local_58;
  FileDescriptorProto *local_50;
  char *local_48;
  FileDescriptorProto *local_40;
  char *local_38;
  FileDescriptorProto *local_30;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_28;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_20;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_18;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_10;
  
  local_98 = proto;
  proto_local = (FileDescriptorProto *)this;
  local_a8 = name(this);
  local_78 = &local_a8;
  local_10 = &proto->field_0;
  local_70 = proto;
  puVar5 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar5 = *puVar5 | 1;
  this_local = (FileDescriptor *)local_78->_M_len;
  local_80 = local_78->_M_str;
  pAVar6 = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_80;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar6);
  local_b8 = package(this);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_b8);
  pFVar1 = local_98;
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    local_c8 = package(this);
    local_50 = pFVar1;
    local_58 = &local_c8;
    local_18 = &pFVar1->field_0;
    puVar5 = internal::HasBits<1>::operator[](&(pFVar1->field_0)._impl_._has_bits_,0);
    *puVar5 = *puVar5 | 2;
    local_68 = local_58->_M_len;
    local_60 = local_58->_M_str;
    pAVar6 = MessageLite::GetArena((MessageLite *)pFVar1);
    value_00._M_str = local_60;
    value_00._M_len = local_68;
    internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.package_,value_00,pAVar6);
  }
  EVar4 = edition(this);
  pFVar1 = local_98;
  if (EVar4 == EDITION_PROTO3) {
    local_40 = local_98;
    local_48 = "proto3";
    local_20 = &local_98->field_0;
    puVar5 = internal::HasBits<1>::operator[](&(local_98->field_0)._impl_._has_bits_,0);
    pcVar2 = local_48;
    *puVar5 = *puVar5 | 4;
    pAVar6 = MessageLite::GetArena((MessageLite *)pFVar1);
    internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.syntax_,pcVar2,pAVar6);
  }
  else {
    EVar4 = edition(this);
    bVar3 = anon_unknown_24::IsLegacyEdition(EVar4);
    pFVar1 = local_98;
    if (!bVar3) {
      local_30 = local_98;
      local_38 = "editions";
      local_28 = &local_98->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(local_98->field_0)._impl_._has_bits_,0);
      pcVar2 = local_38;
      *puVar5 = *puVar5 | 4;
      pAVar6 = MessageLite::GetArena((MessageLite *)pFVar1);
      internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.syntax_,pcVar2,pAVar6);
      pFVar1 = local_98;
      EVar4 = edition(this);
      FileDescriptorProto::set_edition(pFVar1,EVar4);
    }
  }
  pFVar7 = options(this);
  pFVar8 = FileOptions::default_instance();
  if (pFVar7 != pFVar8) {
    pFVar7 = options(this);
    pFVar8 = FileDescriptorProto::mutable_options(local_98);
    FileOptions::operator=(pFVar8,pFVar7);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::FileDescriptorProto>
            (this->proto_features_,local_98);
  return;
}

Assistant:

void FileDescriptor::CopyHeadingTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) {
    proto->set_package(package());
  }

  if (edition() == Edition::EDITION_PROTO3) {
    proto->set_syntax("proto3");
  } else if (!IsLegacyEdition(edition())) {
    proto->set_syntax("editions");
    proto->set_edition(edition());
  }

  if (&options() != &FileOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}